

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O2

void Fl_Shared_Image::add_handler(Fl_Shared_Handler f)

{
  Fl_Shared_Handler *__src;
  ulong uVar1;
  Fl_Shared_Handler *pp_Var2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = alloc_handlers_;
  iVar4 = num_handlers_;
  __src = handlers_;
  uVar3 = 0;
  uVar1 = 0;
  if (0 < num_handlers_) {
    uVar3 = (ulong)(uint)num_handlers_;
  }
  do {
    if (uVar3 == uVar1) {
      if (alloc_handlers_ <= num_handlers_) {
        lVar5 = (long)alloc_handlers_;
        uVar1 = 0xffffffffffffffff;
        if (-0x21 < alloc_handlers_) {
          uVar1 = lVar5 * 8 + 0x100;
        }
        pp_Var2 = (Fl_Shared_Handler *)operator_new__(uVar1);
        if (iVar6 == 0) {
          iVar6 = 0;
        }
        else {
          memcpy(pp_Var2,__src,lVar5 << 3);
          if (__src != (Fl_Shared_Handler *)0x0) {
            operator_delete__(__src);
            iVar4 = num_handlers_;
            iVar6 = alloc_handlers_;
          }
        }
        alloc_handlers_ = iVar6 + 0x20;
        num_handlers_ = iVar4;
        handlers_ = pp_Var2;
      }
      handlers_[num_handlers_] = f;
      num_handlers_ = num_handlers_ + 1;
      return;
    }
    pp_Var2 = handlers_ + uVar1;
    uVar1 = uVar1 + 1;
  } while (*pp_Var2 != f);
  return;
}

Assistant:

void Fl_Shared_Image::add_handler(Fl_Shared_Handler f) {
  int			i;		// Looping var...
  Fl_Shared_Handler	*temp;		// New image handler array...

  // First see if we have already added the handler...
  for (i = 0; i < num_handlers_; i ++) {
    if (handlers_[i] == f) return;
  }

  if (num_handlers_ >= alloc_handlers_) {
    // Allocate more memory...
    temp = new Fl_Shared_Handler [alloc_handlers_ + 32];

    if (alloc_handlers_) {
      memcpy(temp, handlers_, alloc_handlers_ * sizeof(Fl_Shared_Handler));

      delete[] handlers_;
    }

    handlers_       = temp;
    alloc_handlers_ += 32;
  }

  handlers_[num_handlers_] = f;
  num_handlers_ ++;
}